

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

void __thiscall
chrono::ChQuaternion<double>::Q_to_AngAxis
          (ChQuaternion<double> *this,double *a_angle,ChVector<double> *a_axis)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_data[2] * this->m_data[2];
  auVar2 = vfmadd231sd_fma(auVar5,auVar2,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_data[3];
  auVar2 = vfmadd213sd_fma(auVar3,auVar3,auVar2);
  if (auVar2._0_8_ <= 0.0) {
    *a_angle = 0.0;
    a_axis->m_data[0] = 1.0;
    a_axis->m_data[1] = 0.0;
    a_axis->m_data[2] = 0.0;
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar1 = atan2(auVar2._0_8_,this->m_data[0]);
    *a_angle = dVar1 + dVar1;
    dVar1 = 1.0 / auVar2._0_8_;
    a_axis->m_data[0] = dVar1 * this->m_data[1];
    a_axis->m_data[1] = dVar1 * this->m_data[2];
    a_axis->m_data[2] = dVar1 * this->m_data[3];
    ChVector<double>::Normalize(a_axis);
  }
  dVar1 = *a_angle;
  if (dVar1 <= 3.141592653589793) {
    if (-3.141592653589793 <= dVar1) {
      return;
    }
    dVar4 = 6.283185307179586;
  }
  else {
    dVar4 = -6.283185307179586;
  }
  *a_angle = dVar1 + dVar4;
  return;
}

Assistant:

inline void ChQuaternion<Real>::Q_to_AngAxis(Real& a_angle, ChVector<Real>& a_axis) const {
    Real sin_squared = m_data[1] * m_data[1] + m_data[2] * m_data[2] + m_data[3] * m_data[3];
    // For non-zero rotation
    if (sin_squared > 0) {
        Real sin_theta = sqrt(sin_squared);
        a_angle = 2 * atan2(sin_theta, m_data[0]);
        Real k = 1 / sin_theta;
        a_axis.x() = m_data[1] * k;
        a_axis.y() = m_data[2] * k;
        a_axis.z() = m_data[3] * k;
        a_axis.Normalize();
    } else {
        // For almost zero rotation
        a_angle = 0.0;
        a_axis.x() = 1;  // m_data[1] * 2.0;
        a_axis.y() = 0;  // m_data[2] * 2.0;
        a_axis.z() = 0;  // m_data[3] * 2.0;
    }
    // Ensure that angle is always in  [-PI...PI] range
    auto PI = static_cast<Real>(CH_C_PI);
    if (a_angle > PI) {
        a_angle -= 2 * PI;
    } else if (a_angle < -PI) {
        a_angle += 2 * PI;
    }
}